

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O0

Abc_Cex_t *
Bmc_CexCareBits(Gia_Man_t *p,Abc_Cex_t *pCexState,Abc_Cex_t *pCexImpl,Abc_Cex_t *pCexEss,
               int fFindAll,int fVerbose)

{
  undefined8 uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Abc_Cex_t *pCex;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  int local_50;
  int iBit;
  int k;
  int i;
  int fCompl1;
  int fCompl0;
  Gia_Obj_t *pObj;
  Abc_Cex_t *pNew;
  int fVerbose_local;
  int fFindAll_local;
  Abc_Cex_t *pCexEss_local;
  Abc_Cex_t *pCexImpl_local;
  Abc_Cex_t *pCexState_local;
  Gia_Man_t *p_local;
  
  if (pCexState->nRegs != 0) {
    __assert_fail("pCexState->nRegs == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                  ,0x22c,
                  "Abc_Cex_t *Bmc_CexCareBits(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *, Abc_Cex_t *, int, int)"
                 );
  }
  iVar3 = Gia_ManCiNum(p);
  pCex = Abc_CexAlloc(0,iVar3,pCexState->iFrame + 1);
  pCex->iFrame = pCexState->iFrame;
  pCex->iPo = pCexState->iPo;
  Gia_ManCleanMark01(p);
  pGVar7 = Gia_ManConst0(p);
  *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffbfffffff;
  pGVar7 = Gia_ManConst0(p);
  *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xbfffffffffffffff | 0x4000000000000000;
  iBit = pCexState->iFrame;
  do {
    if (iBit < 0) {
      if (pCexEss == (Abc_Cex_t *)0x0) {
        printf("Care bits:    ");
      }
      else {
        printf("Minimized:    ");
      }
      iVar3 = Gia_ManPiNum(p);
      Bmc_CexPrint(pCex,iVar3,fVerbose);
      return pCex;
    }
    iVar3 = pCexState->nPis * iBit;
    local_50 = 0;
    while( true ) {
      iVar4 = Vec_IntSize(p->vCis);
      bVar8 = false;
      if (local_50 < iVar4) {
        _fCompl1 = Gia_ManCi(p,local_50);
        bVar8 = _fCompl1 != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      uVar6 = Abc_InfoHasBit((uint *)(pCexState + 1),iVar3 + local_50);
      *(ulong *)_fCompl1 = *(ulong *)_fCompl1 & 0xffffffffbfffffff | ((ulong)uVar6 & 1) << 0x1e;
      *(ulong *)_fCompl1 = *(ulong *)_fCompl1 & 0xbfffffffffffffff;
      if (pCexImpl != (Abc_Cex_t *)0x0) {
        uVar6 = Abc_InfoHasBit((uint *)(pCexImpl + 1),iVar3 + local_50);
        *(ulong *)_fCompl1 =
             *(ulong *)_fCompl1 & 0xbfffffffffffffff |
             ((ulong)((uint)(*(ulong *)_fCompl1 >> 0x3e) & 1 | uVar6) & 1) << 0x3e;
      }
      if (pCexEss != (Abc_Cex_t *)0x0) {
        uVar6 = Abc_InfoHasBit((uint *)(pCexEss + 1),iVar3 + local_50);
        *(ulong *)_fCompl1 =
             *(ulong *)_fCompl1 & 0xbfffffffffffffff |
             ((ulong)((uint)(*(ulong *)_fCompl1 >> 0x3e) & 1 | uVar6) & 1) << 0x3e;
      }
      local_50 = local_50 + 1;
    }
    local_50 = 0;
    while( true ) {
      bVar8 = false;
      if (local_50 < p->nObjs) {
        _fCompl1 = Gia_ManObj(p,local_50);
        bVar8 = _fCompl1 != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar3 = Gia_ObjIsAnd(_fCompl1);
      if (iVar3 != 0) {
        pGVar7 = Gia_ObjFanin0(_fCompl1);
        uVar2 = *(ulong *)pGVar7;
        uVar6 = Gia_ObjFaninC0(_fCompl1);
        uVar6 = (uint)(uVar2 >> 0x1e) & 1 ^ uVar6;
        pGVar7 = Gia_ObjFanin1(_fCompl1);
        uVar2 = *(ulong *)pGVar7;
        uVar5 = Gia_ObjFaninC1(_fCompl1);
        uVar5 = (uint)(uVar2 >> 0x1e) & 1 ^ uVar5;
        *(ulong *)_fCompl1 =
             *(ulong *)_fCompl1 & 0xffffffffbfffffff | ((ulong)(uVar6 & uVar5) & 1) << 0x1e;
        if ((*(ulong *)_fCompl1 >> 0x1e & 1) == 0) {
          if ((uVar6 == 0) && (uVar5 == 0)) {
            pGVar7 = Gia_ObjFanin0(_fCompl1);
            uVar1 = *(undefined8 *)pGVar7;
            pGVar7 = Gia_ObjFanin1(_fCompl1);
            *(ulong *)_fCompl1 =
                 *(ulong *)_fCompl1 & 0xbfffffffffffffff |
                 (ulong)((uint)((ulong)uVar1 >> 0x3e) & 1 |
                        (uint)((ulong)*(undefined8 *)pGVar7 >> 0x3e) & 1) << 0x3e;
          }
          else if (uVar6 == 0) {
            pGVar7 = Gia_ObjFanin0(_fCompl1);
            *(ulong *)_fCompl1 =
                 *(ulong *)_fCompl1 & 0xbfffffffffffffff |
                 (ulong)((uint)((ulong)*(undefined8 *)pGVar7 >> 0x3e) & 1) << 0x3e;
          }
          else {
            if (uVar5 != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                            ,0x250,
                            "Abc_Cex_t *Bmc_CexCareBits(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *, Abc_Cex_t *, int, int)"
                           );
            }
            pGVar7 = Gia_ObjFanin1(_fCompl1);
            *(ulong *)_fCompl1 =
                 *(ulong *)_fCompl1 & 0xbfffffffffffffff |
                 (ulong)((uint)((ulong)*(undefined8 *)pGVar7 >> 0x3e) & 1) << 0x3e;
          }
        }
        else {
          pGVar7 = Gia_ObjFanin0(_fCompl1);
          uVar1 = *(undefined8 *)pGVar7;
          pGVar7 = Gia_ObjFanin1(_fCompl1);
          *(ulong *)_fCompl1 =
               *(ulong *)_fCompl1 & 0xbfffffffffffffff |
               (ulong)((uint)((ulong)uVar1 >> 0x3e) & 1 &
                      (uint)((ulong)*(undefined8 *)pGVar7 >> 0x3e) & 1) << 0x3e;
        }
      }
      local_50 = local_50 + 1;
    }
    local_50 = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vCos);
      bVar8 = false;
      if (local_50 < iVar3) {
        _fCompl1 = Gia_ManCo(p,local_50);
        bVar8 = _fCompl1 != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      pGVar7 = Gia_ObjFanin0(_fCompl1);
      uVar2 = *(ulong *)pGVar7;
      uVar6 = Gia_ObjFaninC0(_fCompl1);
      *(ulong *)_fCompl1 =
           *(ulong *)_fCompl1 & 0xffffffffbfffffff |
           ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar6) & 1) << 0x1e;
      local_50 = local_50 + 1;
    }
    if (iBit == pCexState->iFrame) {
      pGVar7 = Gia_ManPo(p,pCexState->iPo);
      if (((uint)(*(ulong *)pGVar7 >> 0x1e) & 1) != 1) {
        __assert_fail("Gia_ManPo(p, pCexState->iPo)->fMark0 == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                      ,599,
                      "Abc_Cex_t *Bmc_CexCareBits(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *, Abc_Cex_t *, int, int)"
                     );
      }
      if (fFindAll == 0) {
        pGVar7 = Gia_ManPo(p,pCexState->iPo);
        pGVar7 = Gia_ObjFanin0(pGVar7);
        Bmc_CexCareBits2_rec(p,pGVar7);
      }
      else {
        pGVar7 = Gia_ManPo(p,pCexState->iPo);
        pGVar7 = Gia_ObjFanin0(pGVar7);
        Bmc_CexCareBits_rec(p,pGVar7);
      }
    }
    else {
      local_50 = 0;
      while( true ) {
        iVar3 = Gia_ManRegNum(p);
        bVar8 = false;
        if (local_50 < iVar3) {
          iVar3 = Gia_ManPoNum(p);
          _fCompl1 = Gia_ManCo(p,iVar3 + local_50);
          bVar8 = _fCompl1 != (Gia_Obj_t *)0x0;
        }
        if (!bVar8) break;
        iVar3 = pCex->nPis;
        iVar4 = Gia_ManPiNum(p);
        iVar3 = Abc_InfoHasBit((uint *)(pCex + 1),iVar3 * (iBit + 1) + iVar4 + local_50);
        if (iVar3 != 0) {
          if (fFindAll == 0) {
            pGVar7 = Gia_ObjFanin0(_fCompl1);
            Bmc_CexCareBits2_rec(p,pGVar7);
          }
          else {
            pGVar7 = Gia_ObjFanin0(_fCompl1);
            Bmc_CexCareBits_rec(p,pGVar7);
          }
        }
        local_50 = local_50 + 1;
      }
    }
    local_50 = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vCis);
      bVar8 = false;
      if (local_50 < iVar3) {
        _fCompl1 = Gia_ManCi(p,local_50);
        bVar8 = _fCompl1 != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      if (((*(ulong *)_fCompl1 >> 0x3e & 1) != 0) &&
         ((*(ulong *)_fCompl1 = *(ulong *)_fCompl1 & 0xbfffffffffffffff,
          pCexImpl == (Abc_Cex_t *)0x0 ||
          (iVar3 = Abc_InfoHasBit((uint *)(pCexImpl + 1),pCex->nPis * iBit + local_50), iVar3 == 0))
         )) {
        Abc_InfoSetBit((uint *)(pCex + 1),pCex->nPis * iBit + local_50);
      }
      local_50 = local_50 + 1;
    }
    iBit = iBit + -1;
  } while( true );
}

Assistant:

Abc_Cex_t * Bmc_CexCareBits( Gia_Man_t * p, Abc_Cex_t * pCexState, Abc_Cex_t * pCexImpl, Abc_Cex_t * pCexEss, int fFindAll, int fVerbose )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj;
    int fCompl0, fCompl1;
    int i, k, iBit;
    assert( pCexState->nRegs == 0 );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCexState->iFrame + 1 );
    pNew->iFrame = pCexState->iFrame;
    pNew->iPo    = pCexState->iPo;
    // set initial state
    Gia_ManCleanMark01(p);
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManConst0(p)->fMark1 = 1;
    for ( i = pCexState->iFrame; i >= 0; i-- )
    {
        // set correct values
        iBit = pCexState->nPis * i;
        Gia_ManForEachCi( p, pObj, k )
        {
            pObj->fMark0 = Abc_InfoHasBit(pCexState->pData, iBit+k);
            pObj->fMark1 = 0;
            if ( pCexImpl )
                pObj->fMark1 |= Abc_InfoHasBit(pCexImpl->pData, iBit+k);
            if ( pCexEss )
                pObj->fMark1 |= Abc_InfoHasBit(pCexEss->pData, iBit+k);
        }
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        // move values from COs to CIs
        if ( i == pCexState->iFrame )
        {
            assert( Gia_ManPo(p, pCexState->iPo)->fMark0 == 1 );
            if ( fFindAll )
                Bmc_CexCareBits_rec( p, Gia_ObjFanin0(Gia_ManPo(p, pCexState->iPo)) );
            else
                Bmc_CexCareBits2_rec( p, Gia_ObjFanin0(Gia_ManPo(p, pCexState->iPo)) );
        }
        else
        {
            Gia_ManForEachRi( p, pObj, k )
                if ( Abc_InfoHasBit(pNew->pData, pNew->nPis * (i+1) + Gia_ManPiNum(p) + k) )
                {
                     if ( fFindAll )
                         Bmc_CexCareBits_rec( p, Gia_ObjFanin0(pObj) );
                     else
                         Bmc_CexCareBits2_rec( p, Gia_ObjFanin0(pObj) );
                }
        }
        // save the results
        Gia_ManForEachCi( p, pObj, k )
            if ( pObj->fMark1 )
            {
                pObj->fMark1 = 0;
                if ( pCexImpl == NULL || !Abc_InfoHasBit(pCexImpl->pData, pNew->nPis * i + k) )
                    Abc_InfoSetBit(pNew->pData, pNew->nPis * i + k);
            }
    }
    if ( pCexEss )
        printf( "Minimized:    " );
    else
        printf( "Care bits:    " );
    Bmc_CexPrint( pNew, Gia_ManPiNum(p), fVerbose );
    return pNew;
}